

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::GLSL420Pack::InitializerListTest::getVectorConstructor_abi_cxx11_
          (string *__return_storage_ptr__,InitializerListTest *this,GLuint column,GLuint size)

{
  GLchar *__s;
  InitializerListTest *this_00;
  string local_60;
  string local_40 [32];
  
  if (size - 5 < 0xfffffffc) {
    __s = (char *)0x0;
  }
  else {
    __s = Utils::getTypeName::float_lut[0][size - 1];
  }
  std::__cxx11::string::string<std::allocator<char>>(local_40,__s,(allocator<char> *)&local_60);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  this_00 = (InitializerListTest *)0x17a2f58;
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  getVectorValues_abi_cxx11_(&local_60,this_00,column,size);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string InitializerListTest::getVectorConstructor(GLuint column, GLuint size)
{
	const std::string& type_name = Utils::getTypeName(Utils::FLOAT, 1 /*n_cols*/, size);

	std::string result;

	result.append(type_name);
	result.append("(");
	result.append(getVectorValues(column, size));
	result.append(")");

	return result;
}